

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall adios2::core::Group::~Group(Group *this)

{
  string *in_RDI;
  
  std::shared_ptr<adios2::core::Group>::~shared_ptr((shared_ptr<adios2::core::Group> *)0x96de6c);
  std::__cxx11::string::~string(in_RDI + 0x38);
  std::shared_ptr<adios2::core::Group::TreeMap>::~shared_ptr
            ((shared_ptr<adios2::core::Group::TreeMap> *)0x96de88);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

Group::~Group() = default;